

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

bool testing::Mock::VerifyAndClear(void *mock_obj)

{
  byte bVar1;
  void *in_RDI;
  MutexLock l;
  MutexBase *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  void *in_stack_fffffffffffffff0;
  
  internal::GTestMutexLock::GTestMutexLock
            ((GTestMutexLock *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  ClearDefaultActionsLocked(in_stack_fffffffffffffff0);
  bVar1 = VerifyAndClearExpectationsLocked(in_RDI);
  internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x16d630);
  return (bool)(bVar1 & 1);
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  ClearDefaultActionsLocked(mock_obj);
  return VerifyAndClearExpectationsLocked(mock_obj);
}